

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MES.h
# Opt level: O0

int ConnectMES(MES *pMES,char *szCfgFilePath)

{
  int iVar1;
  char *pcVar2;
  char local_128 [8];
  char line [256];
  FILE *file;
  char *szCfgFilePath_local;
  MES *pMES_local;
  
  line[0xf8] = '\0';
  line[0xf9] = '\0';
  line[0xfa] = '\0';
  line[0xfb] = '\0';
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  memset(pMES->szCfgFilePath,0,0x100);
  sprintf(pMES->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(local_128,0,0x100);
    memset(pMES->szDevPath,0,0x100);
    sprintf(pMES->szDevPath,"COM1");
    pMES->BaudRate = 0x1c200;
    pMES->timeout = 500;
    pMES->threadperiod = 100;
    pMES->bSaveRawData = 1;
    line._248_8_ = fopen(szCfgFilePath,"r");
    if ((FILE *)line._248_8_ == (FILE *)0x0) {
      printf("Configuration file not found.\n");
    }
    else {
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%255s",pMES->szDevPath);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pMES->BaudRate);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pMES->timeout);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pMES->threadperiod);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      pcVar2 = fgets3((FILE *)line._248_8_,local_128,0x100);
      if (pcVar2 == (char *)0x0) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = __isoc99_sscanf(local_128,"%d",&pMES->bSaveRawData);
      if (iVar1 != 1) {
        printf("Invalid configuration file.\n");
      }
      iVar1 = fclose((FILE *)line._248_8_);
      if (iVar1 != 0) {
        printf("fclose() failed.\n");
      }
    }
  }
  if (pMES->threadperiod < 0) {
    printf("Invalid parameter : threadperiod.\n");
    pMES->threadperiod = 100;
  }
  pMES->LastDistance = 0.0;
  iVar1 = OpenRS232Port(&pMES->RS232Port,pMES->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pMES->RS232Port,pMES->BaudRate,'\0',0,'\b','\0',pMES->timeout);
    if (iVar1 == 0) {
      printf("MES connected.\n");
      pMES_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a MES.\n");
      CloseRS232Port(&pMES->RS232Port);
      pMES_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a MES.\n");
    pMES_local._4_4_ = 1;
  }
  return pMES_local._4_4_;
}

Assistant:

inline int ConnectMES(MES* pMES, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pMES->szCfgFilePath, 0, sizeof(pMES->szCfgFilePath));
	sprintf(pMES->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pMES->szDevPath, 0, sizeof(pMES->szDevPath));
		sprintf(pMES->szDevPath, "COM1");
		pMES->BaudRate = 115200;
		pMES->timeout = 500;
		pMES->threadperiod = 100;
		pMES->bSaveRawData = 1;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pMES->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMES->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pMES->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pMES->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pMES->pfSaveFile = NULL;

	pMES->LastDistance = 0;

	if (OpenRS232Port(&pMES->RS232Port, pMES->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MES.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pMES->RS232Port, pMES->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pMES->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MES.\n");
		CloseRS232Port(&pMES->RS232Port);
		return EXIT_FAILURE;
	}

	printf("MES connected.\n");

	return EXIT_SUCCESS;
}